

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_decomposer.hpp
# Opt level: O3

void __thiscall
Catch::BinaryExpr<bool,_bool>::streamReconstructedExpression
          (BinaryExpr<bool,_bool> *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  undefined4 *puVar2;
  string *in_R9;
  StringRef op;
  undefined4 *local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined1 auStack_44 [12];
  undefined4 *local_38;
  undefined8 local_30;
  undefined4 local_28;
  undefined1 auStack_24 [12];
  
  if ((this->super_ITransientExpression).field_0xa == '\x01') {
    puVar2 = (undefined4 *)auStack_44;
    local_48 = 0x65757274;
    local_50 = 4;
  }
  else {
    puVar2 = (undefined4 *)((long)auStack_44 + 1);
    auStack_44[0] = 0x65;
    local_48 = 0x736c6166;
    local_50 = 5;
  }
  *(undefined1 *)puVar2 = 0;
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  if (this->m_rhs == true) {
    puVar2 = (undefined4 *)auStack_24;
    local_28 = 0x65757274;
    local_30 = 4;
  }
  else {
    puVar2 = (undefined4 *)((long)auStack_24 + 1);
    auStack_24[0] = 0x65;
    local_28 = 0x736c6166;
    local_30 = 5;
  }
  *(undefined1 *)puVar2 = 0;
  op.m_size = (size_type)&local_38;
  op.m_start = pcVar1;
  local_58 = &local_48;
  local_38 = &local_28;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_58,lhs,op,in_R9);
  if (local_38 != &local_28) {
    operator_delete(local_38,CONCAT44(auStack_24._0_4_,local_28) + 1);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT44(auStack_44._0_4_,local_48) + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }